

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestParseEvent(void)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_22c;
  allocator_type local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  string local_228;
  string local_208 [32];
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  events;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  istringstream is;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"event",(allocator<char> *)&local_1e8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&local_228,_S_in);
  std::__cxx11::string::~string((string *)&local_228);
  ParseEvent_abi_cxx11_(&local_228,(istream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Parse event without leading spaces",(allocator<char> *)&events);
  AssertEqual<std::__cxx11::string,char[6]>(&local_228,(char (*) [6])0x1150ed,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"   sport event ",(allocator<char> *)&local_1e8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&local_228,_S_in);
  std::__cxx11::string::~string((string *)&local_228);
  ParseEvent_abi_cxx11_(&local_228,(istream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Parse event with leading spaces",(allocator<char> *)&events);
  AssertEqual<std::__cxx11::string,char[13]>(&local_228,(char (*) [13])0x1150a7,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"  first event  \n  second event",(allocator<char> *)&local_1e8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&local_228,_S_in);
  std::__cxx11::string::~string((string *)&local_228);
  events.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  events.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  events.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseEvent_abi_cxx11_(&local_228,(istream *)&is);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&events,&local_228
            );
  std::__cxx11::string::~string((string *)&local_228);
  ParseEvent_abi_cxx11_(&local_228,(istream *)&is);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&events,&local_228
            );
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"first event  ",&local_229);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"second event",&local_22a);
  __l._M_len = 2;
  __l._M_array = &local_228;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8,__l,&local_22b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Parse multiple events",&local_22c);
  AssertEqual<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&events,&local_1a8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_228._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return;
}

Assistant:

void TestParseEvent() {
    {
        istringstream is("event");
        AssertEqual(ParseEvent(is), "event", "Parse event without leading spaces");
    }
    {
        istringstream is("   sport event ");
        AssertEqual(ParseEvent(is), "sport event ", "Parse event with leading spaces");
    }
    {
        istringstream is("  first event  \n  second event");
        vector<string> events;
        events.push_back(ParseEvent(is));
        events.push_back(ParseEvent(is));
        AssertEqual(events, vector<string>{"first event  ", "second event"}, "Parse multiple events");
    }
}